

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrRenderModelPropertiesFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XrRenderModelPropertiesFB *pXVar2;
  byte bVar3;
  XrStructureType XVar4;
  pointer pcVar5;
  PFN_xrStructureTypeToString p_Var6;
  void *value_00;
  XrStructureType __val;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char *pcVar10;
  XrInstance pXVar11;
  invalid_argument *this;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint __len;
  char cVar16;
  string flags_prefix;
  string type_prefix;
  string modelkey_prefix;
  string modelname_prefix;
  string vendorid_prefix;
  string next_prefix;
  string modelversion_prefix;
  string __str_2;
  ostringstream oss_vendorId;
  ostringstream oss_modelVersion;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_328,'\x12');
  *local_328._M_dataplus._M_p = '0';
  local_328._M_dataplus._M_p[1] = 'x';
  pcVar10 = local_328._M_dataplus._M_p + (local_328._M_string_length - 1);
  lVar13 = 0;
  do {
    bVar3 = local_1a8[lVar13];
    *pcVar10 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
    pcVar10[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
    lVar13 = lVar13 + 1;
    pcVar10 = pcVar10 + -2;
  } while (lVar13 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_428,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_428);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar4 = value->type;
    __val = -XVar4;
    if (0 < (int)XVar4) {
      __val = XVar4;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar15 = (ulong)__val;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar12 = (uint)uVar15;
        if (uVar12 < 100) {
          __len = __len - 2;
          goto LAB_001a1bde;
        }
        if (uVar12 < 1000) {
          __len = __len - 1;
          goto LAB_001a1bde;
        }
        if (uVar12 < 10000) goto LAB_001a1bde;
        uVar15 = uVar15 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar12);
      __len = __len + 1;
    }
LAB_001a1bde:
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_328,(char)__len - (char)((int)XVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_328._M_dataplus._M_p + (XVar4 >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_428,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_308 = 0;
    uStack_300 = 0;
    local_328.field_2._M_allocated_capacity = 0;
    local_328.field_2._8_8_ = 0;
    local_328._M_dataplus._M_p = (pointer)0x0;
    local_328._M_string_length = 0;
    p_Var6 = gen_dispatch_table->StructureTypeToString;
    pXVar11 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar11,value->type,(char *)&local_328);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_428,(char (*) [64])&local_328);
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_3a8 = local_398;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3a8);
  value_00 = value->next;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_3a8,local_3a0 + (long)local_3a8);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid Operation");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3c8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"0x",2);
  *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_328);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_3c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  pXVar2 = (XrRenderModelPropertiesFB *)(local_1a8 + 0x10);
  if ((XrRenderModelPropertiesFB *)local_1a8._0_8_ != pXVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3e8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,char_const(&)[64]>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])0x2a4c54,&local_3e8,&value->modelName);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_408,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_408);
  uVar15 = value->modelKey;
  cVar16 = '\x01';
  if (9 < uVar15) {
    uVar14 = uVar15;
    cVar8 = '\x04';
    do {
      cVar16 = cVar8;
      if (uVar14 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_001a1ebb;
      }
      if (uVar14 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_001a1ebb;
      }
      if (uVar14 < 10000) goto LAB_001a1ebb;
      bVar9 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar8 = cVar16 + '\x04';
    } while (bVar9);
    cVar16 = cVar16 + '\x01';
  }
LAB_001a1ebb:
  local_1a8._0_8_ = pXVar2;
  std::__cxx11::string::_M_construct((ulong)local_1a8,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1a8._0_8_,local_1a8._8_4_,uVar15);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [19])"XrRenderModelKeyFB",&local_408,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrRenderModelPropertiesFB *)local_1a8._0_8_ != pXVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_388);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
  *(uint *)((long)auStack_190 + *(XrRenderModelKeyFB *)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + *(XrRenderModelKeyFB *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5
       | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_388,&local_448);
  paVar1 = &local_448.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_448,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_448);
  uVar15 = value->flags;
  cVar16 = '\x01';
  if (9 < uVar15) {
    uVar14 = uVar15;
    cVar8 = '\x04';
    do {
      cVar16 = cVar8;
      if (uVar14 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_001a2077;
      }
      if (uVar14 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_001a2077;
      }
      if (uVar14 < 10000) goto LAB_001a2077;
      bVar9 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar8 = cVar16 + '\x04';
    } while (bVar9);
    cVar16 = cVar16 + '\x01';
  }
LAB_001a2077:
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_368,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_368._M_dataplus._M_p,(uint)local_368._M_string_length,uVar15);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[21],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [21])"XrRenderModelFlagsFB",&local_448,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
  std::ios_base::~ios_base(local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8,local_398[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrRenderModelPropertiesFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string vendorid_prefix = prefix;
        vendorid_prefix += "vendorId";
        std::ostringstream oss_vendorId;
        oss_vendorId << "0x" << std::hex << (value->vendorId);
        contents.emplace_back("uint32_t", vendorid_prefix, oss_vendorId.str());
        std::string modelname_prefix = prefix;
        modelname_prefix += "modelName";
        contents.emplace_back("char*", modelname_prefix, value->modelName);
        std::string modelkey_prefix = prefix;
        modelkey_prefix += "modelKey";
        contents.emplace_back("XrRenderModelKeyFB", modelkey_prefix, std::to_string(value->modelKey));
        std::string modelversion_prefix = prefix;
        modelversion_prefix += "modelVersion";
        std::ostringstream oss_modelVersion;
        oss_modelVersion << "0x" << std::hex << (value->modelVersion);
        contents.emplace_back("uint32_t", modelversion_prefix, oss_modelVersion.str());
        std::string flags_prefix = prefix;
        flags_prefix += "flags";
        contents.emplace_back("XrRenderModelFlagsFB", flags_prefix, std::to_string(value->flags));
        return true;
    } catch(...) {
    }
    return false;
}